

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deck.cpp
# Opt level: O0

void __thiscall Deck::~Deck(Deck *this)

{
  bool bVar1;
  reference __filename;
  _Self local_28;
  _List_node_base *local_20;
  _List_iterator<Card_*> local_18;
  iterator it;
  Deck *this_local;
  
  this->_vptr_Deck = (_func_int **)&PTR_revealDeck_0012b090;
  it._M_node = (_List_node_base *)this;
  std::_List_iterator<Card_*>::_List_iterator(&local_18);
  local_20 = (_List_node_base *)
             std::__cxx11::list<Card_*,_std::allocator<Card_*>_>::begin(&this->deck);
  local_18._M_node = local_20;
  while( true ) {
    local_28._M_node =
         (_List_node_base *)std::__cxx11::list<Card_*,_std::allocator<Card_*>_>::end(&this->deck);
    bVar1 = std::operator!=(&local_18,&local_28);
    if (!bVar1) break;
    __filename = std::_List_iterator<Card_*>::operator*(&local_18);
    std::__cxx11::list<Card_*,_std::allocator<Card_*>_>::remove(&this->deck,(char *)__filename);
    local_18._M_node =
         (_List_node_base *)std::__cxx11::list<Card_*,_std::allocator<Card_*>_>::begin(&this->deck);
    std::_List_iterator<Card_*>::operator++(&local_18,0);
  }
  std::__cxx11::list<Card_*,_std::allocator<Card_*>_>::~list(&this->deck);
  return;
}

Assistant:

Deck::~Deck() 
{
    list <Card*>::iterator it;

    for (it = deck.begin(); it != deck.end(); it++)
    {
        deck.remove((*it));
        //delete *it;
        it = deck.begin();
    }
}